

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O0

void __thiscall
trompeloeil::call_matcher<int_(int),_std::tuple<int>_>::run_actions
          (call_matcher<int_(int),_std::tuple<int>_> *this,call_params_type_t<int_(int)> *params,
          call_matcher_list<int_(int)> *saturated_list)

{
  char *name;
  location loc;
  bool bVar1;
  uint uVar2;
  pointer psVar3;
  side_effect_base<int_(int)> *psVar4;
  tuple<int_&> *t;
  side_effect_base<int_(int)> *a;
  iterator __end0;
  iterator __begin0;
  side_effect_list<int_(int)> *__range2;
  undefined1 local_78 [8];
  unique_lock<std::recursive_mutex> lock;
  string local_58;
  call_params_type_t<int_(int)> *local_38;
  unsigned_long uStack_30;
  call_matcher_list<int_(int)> *local_20;
  call_matcher_list<int_(int)> *saturated_list_local;
  call_params_type_t<int_(int)> *params_local;
  call_matcher<int_(int),_std::tuple<int>_> *this_local;
  
  local_20 = saturated_list;
  saturated_list_local = (call_matcher_list<int_(int)> *)params;
  params_local = (call_params_type_t<int_(int)> *)this;
  psVar3 = std::
           unique_ptr<trompeloeil::sequence_handler_base,_std::default_delete<trompeloeil::sequence_handler_base>_>
           ::operator->(&this->sequences);
  bVar1 = sequence_handler_base::is_forbidden(psVar3);
  if (bVar1) {
    this->reported = true;
    name = (this->super_call_matcher_base<int_(int)>).name;
    local_38 = (call_params_type_t<int_(int)> *)(this->super_call_matcher_base<int_(int)>).loc.file;
    uStack_30 = (this->super_call_matcher_base<int_(int)>).loc.line;
    params_string<int&>(&local_58,(trompeloeil *)saturated_list_local,t);
    loc.line = uStack_30;
    loc.file = (char *)local_38;
    params = local_38;
    report_forbidden_call(name,loc,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
  }
  get_lock<void>();
  psVar3 = std::
           unique_ptr<trompeloeil::sequence_handler_base,_std::default_delete<trompeloeil::sequence_handler_base>_>
           ::operator->(&this->sequences);
  uVar2 = (*psVar3->_vptr_sequence_handler_base[3])();
  if ((uVar2 & 1) == 0) {
    psVar3 = std::
             unique_ptr<trompeloeil::sequence_handler_base,_std::default_delete<trompeloeil::sequence_handler_base>_>
             ::operator->(&this->sequences);
    params = (call_params_type_t<int_(int)> *)0x0;
    (*psVar3->_vptr_sequence_handler_base[2])
              (psVar3,0,(this->super_call_matcher_base<int_(int)>).name,
               (this->super_call_matcher_base<int_(int)>).loc.file,
               (this->super_call_matcher_base<int_(int)>).loc.line);
  }
  psVar3 = std::
           unique_ptr<trompeloeil::sequence_handler_base,_std::default_delete<trompeloeil::sequence_handler_base>_>
           ::operator->(&this->sequences);
  sequence_handler_base::increment_call(psVar3);
  psVar3 = std::
           unique_ptr<trompeloeil::sequence_handler_base,_std::default_delete<trompeloeil::sequence_handler_base>_>
           ::operator->(&this->sequences);
  bVar1 = sequence_handler_base::is_satisfied(psVar3);
  if (bVar1) {
    psVar3 = std::
             unique_ptr<trompeloeil::sequence_handler_base,_std::default_delete<trompeloeil::sequence_handler_base>_>
             ::operator->(&this->sequences);
    (*psVar3->_vptr_sequence_handler_base[6])();
  }
  psVar3 = std::
           unique_ptr<trompeloeil::sequence_handler_base,_std::default_delete<trompeloeil::sequence_handler_base>_>
           ::operator->(&this->sequences);
  bVar1 = sequence_handler_base::is_saturated(psVar3);
  if (bVar1) {
    psVar3 = std::
             unique_ptr<trompeloeil::sequence_handler_base,_std::default_delete<trompeloeil::sequence_handler_base>_>
             ::operator->(&this->sequences);
    (*psVar3->_vptr_sequence_handler_base[5])();
    list_elem<trompeloeil::call_matcher_base<int_(int)>_>::unlink
              ((list_elem<trompeloeil::call_matcher_base<int_(int)>_> *)this,(char *)params);
    list<trompeloeil::call_matcher_base<int_(int)>,_trompeloeil::ignore_disposer>::push_back
              (&local_20->
                super_list<trompeloeil::call_matcher_base<int_(int)>,_trompeloeil::ignore_disposer>,
               &this->super_call_matcher_base<int_(int)>);
  }
  __end0 = list<trompeloeil::side_effect_base<int_(int)>,_trompeloeil::delete_disposer>::begin
                     (&this->actions);
  a = (side_effect_base<int_(int)> *)
      list<trompeloeil::side_effect_base<int_(int)>,_trompeloeil::delete_disposer>::end
                (&this->actions);
  while (bVar1 = trompeloeil::operator!=(&__end0,(iterator *)&a), bVar1) {
    psVar4 = list<trompeloeil::side_effect_base<int_(int)>,_trompeloeil::delete_disposer>::iterator
             ::operator*(&__end0);
    (**(code **)(*(long *)psVar4 + 0x10))(psVar4,saturated_list_local);
    list<trompeloeil::side_effect_base<int_(int)>,_trompeloeil::delete_disposer>::iterator::
    operator++(&__end0);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)local_78);
  return;
}

Assistant:

void
    run_actions(
      call_params_type_t<Sig>& params,
      call_matcher_list<Sig> &saturated_list)
    override
    {
      if (sequences->is_forbidden())
      {
        reported = true;
        report_forbidden_call(name, loc, params_string(params));
      }
      auto lock = get_lock();
      {
        if (!sequences->can_be_called())
        {
          sequences->validate(severity::fatal, name, loc);
        }
        sequences->increment_call();
        if (sequences->is_satisfied())
        {
          sequences->retire_predecessors();
        }
        if (sequences->is_saturated())
        {
          sequences->retire();
          this->unlink();
          saturated_list.push_back(this);
        }
      }
      for (auto& a : actions) a.action(params);
    }